

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-shutdown-after-write.c
# Opt level: O3

int run_test_tcp_shutdown_after_write(void)

{
  int iVar1;
  undefined8 uVar2;
  int *piVar3;
  undefined8 *extraout_RDX;
  uv_tcp_t *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  undefined8 uStack_80;
  code *pcStack_78;
  uv_timer_t *puStack_70;
  undefined8 uStack_60;
  undefined1 auStack_58 [56];
  uv_handle_t *local_20;
  undefined1 local_18 [16];
  
  auStack_58._40_8_ = (uv__queue *)0x1ceda3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_18);
  local_20 = (uv_handle_t *)(long)iVar1;
  auStack_58._48_8_ = (uv_handle_t *)0x0;
  if (local_20 == (uv_handle_t *)0x0) {
    auStack_58._40_8_ = (uv__queue *)0x1cedc6;
    uVar2 = uv_default_loop();
    auStack_58._40_8_ = (uv__queue *)0x1cedd8;
    iVar1 = uv_timer_init(uVar2,&timer);
    local_20 = (uv_handle_t *)(long)iVar1;
    auStack_58._48_8_ = (uv_handle_t *)0x0;
    if (local_20 != (uv_handle_t *)0x0) goto LAB_001cefca;
    auStack_58._40_8_ = (uv__queue *)0x1cee10;
    iVar1 = uv_timer_start(&timer,timer_cb,0x7d,0);
    local_20 = (uv_handle_t *)(long)iVar1;
    auStack_58._48_8_ = (uv_handle_t *)0x0;
    if (local_20 != (uv_handle_t *)0x0) goto LAB_001cefd7;
    auStack_58._40_8_ = (uv__queue *)0x1cee3d;
    iVar1 = uv_tcp_init(uVar2,&conn);
    local_20 = (uv_handle_t *)(long)iVar1;
    auStack_58._48_8_ = (uv_handle_t *)0x0;
    if (local_20 != (uv_handle_t *)0x0) goto LAB_001cefe4;
    auStack_58._40_8_ = (uv__queue *)0x1cee7a;
    iVar1 = uv_tcp_connect(&connect_req,&conn,local_18,connect_cb);
    local_20 = (uv_handle_t *)(long)iVar1;
    auStack_58._48_8_ = (uv_handle_t *)0x0;
    if (local_20 != (uv_handle_t *)0x0) goto LAB_001ceff1;
    auStack_58._40_8_ = (uv__queue *)0x1ceea2;
    iVar1 = uv_run(uVar2,0);
    local_20 = (uv_handle_t *)(long)iVar1;
    auStack_58._48_8_ = (uv_handle_t *)0x0;
    if (local_20 != (uv_handle_t *)0x0) goto LAB_001ceffe;
    local_20 = (uv_handle_t *)0x1;
    auStack_58._48_8_ = SEXT48(connect_cb_called);
    if ((uv_handle_t *)auStack_58._48_8_ != (uv_handle_t *)0x1) goto LAB_001cf00b;
    local_20 = (uv_handle_t *)0x1;
    auStack_58._48_8_ = SEXT48(write_cb_called);
    if ((uv_handle_t *)auStack_58._48_8_ != (uv_handle_t *)0x1) goto LAB_001cf018;
    local_20 = (uv_handle_t *)0x1;
    auStack_58._48_8_ = SEXT48(shutdown_cb_called);
    if ((uv_handle_t *)auStack_58._48_8_ != (uv_handle_t *)0x1) goto LAB_001cf025;
    local_20 = (uv_handle_t *)0x1;
    auStack_58._48_8_ = SEXT48(conn_close_cb_called);
    if ((uv_handle_t *)auStack_58._48_8_ != (uv_handle_t *)0x1) goto LAB_001cf032;
    local_20 = (uv_handle_t *)0x1;
    auStack_58._48_8_ = SEXT48(timer_close_cb_called);
    if ((uv_handle_t *)auStack_58._48_8_ == (uv_handle_t *)0x1) {
      auStack_58._40_8_ = (uv__queue *)0x1cef80;
      uv_walk(uVar2,close_walk_cb,0);
      auStack_58._40_8_ = (uv__queue *)0x1cef8a;
      uv_run(uVar2,0);
      local_20 = (uv_handle_t *)0x0;
      auStack_58._40_8_ = (uv__queue *)0x1cef9b;
      iVar1 = uv_loop_close(uVar2);
      auStack_58._48_8_ = SEXT48(iVar1);
      if (local_20 == (uv_handle_t *)auStack_58._48_8_) {
        auStack_58._40_8_ = (uv__queue *)0x1cefb5;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001cf04c;
    }
  }
  else {
    auStack_58._40_8_ = (uv__queue *)0x1cefca;
    run_test_tcp_shutdown_after_write_cold_1();
LAB_001cefca:
    auStack_58._40_8_ = (uv__queue *)0x1cefd7;
    run_test_tcp_shutdown_after_write_cold_2();
LAB_001cefd7:
    auStack_58._40_8_ = (uv__queue *)0x1cefe4;
    run_test_tcp_shutdown_after_write_cold_3();
LAB_001cefe4:
    auStack_58._40_8_ = (uv__queue *)0x1ceff1;
    run_test_tcp_shutdown_after_write_cold_4();
LAB_001ceff1:
    auStack_58._40_8_ = (uv__queue *)0x1ceffe;
    run_test_tcp_shutdown_after_write_cold_5();
LAB_001ceffe:
    auStack_58._40_8_ = (uv__queue *)0x1cf00b;
    run_test_tcp_shutdown_after_write_cold_6();
LAB_001cf00b:
    auStack_58._40_8_ = (uv__queue *)0x1cf018;
    run_test_tcp_shutdown_after_write_cold_7();
LAB_001cf018:
    auStack_58._40_8_ = (uv__queue *)0x1cf025;
    run_test_tcp_shutdown_after_write_cold_8();
LAB_001cf025:
    auStack_58._40_8_ = (uv__queue *)0x1cf032;
    run_test_tcp_shutdown_after_write_cold_9();
LAB_001cf032:
    auStack_58._40_8_ = (uv__queue *)0x1cf03f;
    run_test_tcp_shutdown_after_write_cold_10();
  }
  auStack_58._40_8_ = (uv__queue *)0x1cf04c;
  run_test_tcp_shutdown_after_write_cold_11();
LAB_001cf04c:
  auStack_58._40_8_ = timer_cb;
  run_test_tcp_shutdown_after_write_cold_12();
  auStack_58._0_8_ = (void *)0x1cf069;
  uv_close();
  auStack_58._0_8_ = (void *)0x1cf07a;
  auStack_58._32_16_ = uv_buf_init("TEST",4);
  auStack_58._0_8_ = (void *)0x1cf0a8;
  iVar1 = uv_write(&write_req,&conn,auStack_58 + 0x20,1,write_cb);
  auStack_58._24_8_ = SEXT48(iVar1);
  auStack_58._16_8_ = 0;
  if ((uv_close_cb)auStack_58._24_8_ == (uv_close_cb)0x0) {
    auStack_58._0_8_ = (void *)0x1cf0de;
    iVar1 = uv_shutdown(&shutdown_req,&conn,shutdown_cb);
    auStack_58._24_8_ = SEXT48(iVar1);
    auStack_58._16_8_ = 0;
    if ((uv_close_cb)auStack_58._24_8_ == (uv_close_cb)0x0) {
      return iVar1;
    }
  }
  else {
    auStack_58._0_8_ = (void *)0x1cf10e;
    timer_cb_cold_1();
  }
  iVar1 = (int)auStack_58 + 0x10;
  auStack_58._0_8_ = connect_cb;
  timer_cb_cold_2();
  auStack_58._0_8_ = SEXT48(iVar1);
  uStack_60 = 0;
  if ((void *)auStack_58._0_8_ == (void *)0x0) {
    connect_cb_called = connect_cb_called + 1;
    puStack_70 = (uv_timer_t *)0x1cf15e;
    iVar1 = uv_read_start(&conn,alloc_cb,read_cb);
    auStack_58._0_8_ = SEXT48(iVar1);
    uStack_60 = 0;
    if ((void *)auStack_58._0_8_ == (void *)0x0) {
      return iVar1;
    }
  }
  else {
    puStack_70 = (uv_timer_t *)0x1cf18e;
    connect_cb_cold_1();
  }
  puVar4 = (uv_tcp_t *)auStack_58;
  iVar1 = (int)&uStack_60;
  puStack_70 = (uv_timer_t *)close_cb;
  connect_cb_cold_2();
  if (puVar4 == &conn) {
    piVar3 = &conn_close_cb_called;
  }
  else {
    if (puVar4 != (uv_tcp_t *)&timer) {
      puStack_70 = &timer;
      pcStack_78 = write_cb;
      close_cb_cold_1();
      pcStack_78 = (code *)(long)iVar1;
      uStack_80 = 0;
      if (pcStack_78 == (code *)0x0) {
        write_cb_called = write_cb_called + 1;
        return iVar1;
      }
      iVar1 = (int)&uStack_80;
      write_cb_cold_1();
      if (iVar1 == 0) {
        shutdown_cb_called = shutdown_cb_called + 1;
        iVar1 = uv_close(&conn,close_cb);
        return iVar1;
      }
      shutdown_cb_cold_1();
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x40;
      return 0x3a0500;
    }
    piVar3 = &timer_close_cb_called;
  }
  *piVar3 = *piVar3 + 1;
  return (int)piVar3;
}

Assistant:

TEST_IMPL(tcp_shutdown_after_write) {
  struct sockaddr_in addr;
  uv_loop_t* loop;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  r = uv_timer_start(&timer, timer_cb, 125, 0);
  ASSERT_OK(r);

  r = uv_tcp_init(loop, &conn);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, write_cb_called);
  ASSERT_EQ(1, shutdown_cb_called);
  ASSERT_EQ(1, conn_close_cb_called);
  ASSERT_EQ(1, timer_close_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}